

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_utils.cpp
# Opt level: O2

Graph * multi_agent_planning::generateGraph
                  (Graph *__return_storage_ptr__,int numV,int numConnected,float prob,int cost)

{
  undefined8 uVar1;
  bool bVar2;
  no_property *pnVar3;
  long lVar4;
  long lVar5;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *g_;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *extraout_RDX;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *g__00;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *extraout_RDX_00;
  undefined8 *puVar6;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  *ppVar7;
  undefined8 *puVar8;
  value_type *pvVar9;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  in_stack_fffffffffffffe08;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  in_stack_fffffffffffffe50;
  undefined1 local_168 [32];
  dummy_u local_148;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  *local_128;
  value_type local_120;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  local_108;
  value_type local_70;
  value_type vStack_68;
  undefined1 local_60 [16];
  undefined8 local_50;
  ulong uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_108.first.vBegin.m_value = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_108.first.vCurr.m_value = local_70;
  local_108.first.vEnd.m_value = vStack_68;
  local_108.first.edges.super_type._0_8_ = local_60._0_8_;
  local_108.first.edges.super_type.m_storage.dummy_.aligner_ = (type)local_60._8_8_;
  local_108.first.edges.super_type.m_storage.dummy_._8_8_ = local_50;
  local_108.first.edges.super_type.m_storage.dummy_._16_8_ = uStack_48;
  local_168._0_8_ = gen;
  local_168._8_8_ = (long)numV;
  local_168._16_8_ = (long)numConnected;
  local_168._24_8_ = (double)prob;
  local_148.aligner_ = (type)0x0;
  local_108.first.edges.super_type.m_storage.dummy_._24_8_ = 0;
  local_108.first.m_g =
       (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
        *)0x0;
  local_148._8_8_ = 1;
  local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
  local_148._24_8_ = 0;
  local_128 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
               *)0x1;
  lVar5 = 9;
  puVar6 = (undefined8 *)local_168;
  puVar8 = (undefined8 *)&stack0xfffffffffffffe08;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = *puVar6;
    puVar6 = puVar6 + 1;
    puVar8 = puVar8 + 1;
  }
  ppVar7 = &local_108;
  pvVar9 = (value_type *)&stack0xfffffffffffffe50;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pvVar9 = (ppVar7->first).vBegin.m_value;
    ppVar7 = (pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
              *)&(ppVar7->first).vCurr;
    pvVar9 = pvVar9 + 1;
  }
  boost::
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
  ::
  vec_adj_list_impl<boost::small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>>>
            ((vec_adj_list_impl<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
              *)__return_storage_ptr__,(long)numV,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe50);
  pnVar3 = (no_property *)operator_new(1);
  (__return_storage_ptr__->m_property).px = pnVar3;
  boost::
  edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>
            (&local_108,(boost *)__return_storage_ptr__,g_);
  uVar1 = local_168._24_8_;
  local_168._0_8_ = local_108.first.vBegin.m_value;
  local_168._8_8_ = local_108.first.vCurr.m_value;
  local_168._16_8_ = local_108.first.vEnd.m_value;
  local_168._24_8_ = local_168._24_8_ & 0xffffffffffffff00;
  if (local_108.first.edges.super_type.m_initialized == true) {
    local_148._16_8_ = local_108.first.edges.super_type.m_storage.dummy_._16_8_;
    local_148._24_8_ = local_108.first.edges.super_type.m_storage.dummy_._24_8_;
    local_148.aligner_ = local_108.first.edges.super_type.m_storage.dummy_.aligner_;
    local_148._8_8_ = local_108.first.edges.super_type.m_storage.dummy_._8_8_;
    local_168._25_7_ = SUB87(uVar1,1);
    local_168[0x18] = 1;
  }
  local_128 = local_108.first.m_g;
  g__00 = extraout_RDX;
  while( true ) {
    boost::
    edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>
              (&local_108,(boost *)__return_storage_ptr__,g__00);
    bVar2 = boost::detail::
            adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
            ::operator!=((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
                          *)local_168,&local_108.second);
    if (!bVar2) break;
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
    ::operator*(&local_120,
                (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
                 *)local_168);
    *(int *)local_120.m_eproperty = cost;
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
    ::operator++((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
                  *)local_168);
    g__00 = extraout_RDX_00;
  }
  return __return_storage_ptr__;
}

Assistant:

Graph generateGraph(int numV, int numConnected, float prob, int cost) {
	Graph graph = Graph(SWGen(gen, numV, numConnected, prob, false), SWGen(), numV);
	for (Graph::edge_iterator eIt = edges(graph).first; eIt != edges(graph).second; ++eIt) {
		graph[*eIt].cost = cost;
	}

	return graph;
}